

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall ncnn::Requantize::load_param(Requantize *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  fVar2 = ParamDict::get(in_RSI,0,1.0);
  *(float *)(in_RDI + 0x80) = fVar2;
  fVar2 = ParamDict::get(in_RSI,1,1.0);
  *(float *)(in_RDI + 0x84) = fVar2;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0x8c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(bool *)(in_RDI + 0x90) = iVar1 != 0;
  return 0;
}

Assistant:

int Requantize::load_param(const ParamDict& pd)
{
    scale_in = pd.get(0, 1.f);	// bottom_blob_scale * weight_scale
	scale_out = pd.get(1, 1.f);	// top_blob_scale
    bias_term = pd.get(2, 0);
    bias_data_size = pd.get(3, 0);
    fusion_relu = pd.get(4, 0);

    return 0;
}